

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all.cpp
# Opt level: O0

void test_find_peaks_out_hw(void)

{
  runtime_error *prVar1;
  float local_b8 [2];
  float input [16];
  int peaks [20];
  int local_20 [2];
  int counts;
  int window_size;
  float threshold;
  int M;
  int W;
  int H;
  
  M = 4;
  threshold = 5.60519e-45;
  window_size = 10;
  counts = 0x40000000;
  local_20[1] = 3;
  memset(local_b8,0,0x40);
  input[4] = 3.0;
  input[10] = 1.0;
  trt_pose::parse::find_peaks_out_hw(local_20,(int *)(input + 0xe),local_b8,4,4,10,2.0,3);
  if (local_20[0] != 1) {
    prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar1,"Number of peaks should be 1.");
    __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (input[0xe] != 1.4013e-45) {
    prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar1,"Peak i coordinate should be 1.");
    __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (input[0xf] != 2.8026e-45) {
    prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar1,"Peak j coordinate should be 2,");
    __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void test_find_peaks_out_hw()
{
  const int H = 4;
  const int W = 4;
  const int M = 10;
  const float threshold = 2.0;
  const int window_size = 3;

  int counts;
  int peaks[M * 2];
  const float input[H * W] = {

    0., 0., 0., 0.,
    0., 0., 3., 0.,
    0., 0., 0., 0.,
    1., 0., 0., 0.

  };

  find_peaks_out_hw(&counts, peaks, input, H, W, M, threshold, window_size);

  if (counts != 1) {
    throw std::runtime_error("Number of peaks should be 1.");
  }
  if (peaks[0] != 1) {
    throw std::runtime_error("Peak i coordinate should be 1.");
  }
  if (peaks[1] != 2) {
    throw std::runtime_error("Peak j coordinate should be 2,");
  }
}